

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O0

ssize_t __thiscall
RenX::ExemptionDatabase::write(ExemptionDatabase *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  fpos_t *__pos;
  rep local_70;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  rep local_58 [3];
  undefined1 local_40 [8];
  DataBuffer buffer;
  FILE *file_local;
  Entry *entry_local;
  ExemptionDatabase *this_local;
  
  __pos = (fpos_t *)CONCAT44(in_register_00000034,__fd);
  Jupiter::DataBuffer::DataBuffer((DataBuffer *)local_40);
  fgetpos((FILE *)__buf,__pos);
  Jupiter::DataBuffer::push<unsigned_char>((DataBuffer *)local_40,(uchar *)(__pos + 1));
  local_68.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&__pos[1].__state);
  local_60.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_68);
  local_58[0] = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_60);
  Jupiter::DataBuffer::push<long>((DataBuffer *)local_40,local_58);
  local_70 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                       ((duration<long,_std::ratio<1L,_1L>_> *)(__pos + 2));
  Jupiter::DataBuffer::push<long>((DataBuffer *)local_40,&local_70);
  Jupiter::DataBuffer::push<unsigned_long>
            ((DataBuffer *)local_40,(unsigned_long *)&__pos[2].__state);
  Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_40,(uint *)(__pos + 3));
  Jupiter::DataBuffer::push<unsigned_char>
            ((DataBuffer *)local_40,(uchar *)((long)&__pos[3].__pos + 4));
  Jupiter::DataBuffer::
  push<std::__cxx11::basic_string,char,std::char_traits<char>,std::allocator<char>>
            ((DataBuffer *)local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__pos[3].__state)
  ;
  Jupiter::DataBuffer::push_to((_IO_FILE *)local_40);
  fgetpos((FILE *)__buf,(fpos_t *)&this->m_eof);
  sVar1 = Jupiter::DataBuffer::~DataBuffer((DataBuffer *)local_40);
  return sVar1;
}

Assistant:

void RenX::ExemptionDatabase::write(RenX::ExemptionDatabase::Entry *entry, FILE *file) {
	Jupiter::DataBuffer buffer;
	fgetpos(file, &entry->pos);

	// push data from entry to buffer
	buffer.push(entry->flags);
	buffer.push(static_cast<int64_t>(std::chrono::duration_cast<std::chrono::seconds>(entry->timestamp.time_since_epoch()).count()));
	buffer.push(static_cast<int64_t>(entry->length.count()));
	buffer.push(entry->steamid);
	buffer.push(entry->ip);
	buffer.push(entry->prefix_length);
	buffer.push(entry->setter);

	// push buffer to file
	buffer.push_to(file);
	fgetpos(file, std::addressof(m_eof));
}